

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O0

void printcrbitm(MCInst *MI,uint OpNo,SStream *O)

{
  uint uVar1;
  MCOperand *op;
  SStream *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  uint CCReg;
  uint tmp;
  uint RegNo;
  sbyte local_1c;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  uVar1 = MCOperand_getReg(op);
  switch(uVar1) {
  default:
    local_1c = 0;
    break;
  case 0xb:
    local_1c = 1;
    break;
  case 0xc:
    local_1c = 2;
    break;
  case 0xd:
    local_1c = 3;
    break;
  case 0xe:
    local_1c = 4;
    break;
  case 0xf:
    local_1c = 5;
    break;
  case 0x10:
    local_1c = 6;
    break;
  case 0x11:
    local_1c = 7;
  }
  uVar1 = 0x80 >> local_1c;
  if (uVar1 < 10) {
    SStream_concat(in_RDX,"%u",(ulong)uVar1);
  }
  else {
    SStream_concat(in_RDX,"0x%x",(ulong)uVar1);
  }
  return;
}

Assistant:

static void printcrbitm(MCInst *MI, unsigned OpNo, SStream *O)
{
	unsigned RegNo, tmp;
	unsigned CCReg = MCOperand_getReg(MCInst_getOperand(MI, OpNo));

	switch (CCReg) {
		default: // llvm_unreachable("Unknown CR register");
		case PPC_CR0: RegNo = 0; break;
		case PPC_CR1: RegNo = 1; break;
		case PPC_CR2: RegNo = 2; break;
		case PPC_CR3: RegNo = 3; break;
		case PPC_CR4: RegNo = 4; break;
		case PPC_CR5: RegNo = 5; break;
		case PPC_CR6: RegNo = 6; break;
		case PPC_CR7: RegNo = 7; break;
	}

	tmp = 0x80 >> RegNo;
	if (tmp > HEX_THRESHOLD)
		SStream_concat(O, "0x%x", tmp);
	else
		SStream_concat(O, "%u", tmp);
}